

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testCaseStarting(XmlReporter *this,TestCaseInfo *testInfo)

{
  int iVar1;
  XmlWriter *this_00;
  IConfig *pIVar2;
  long in_RDI;
  TestCaseInfo *in_stack_ffffffffffffff48;
  allocator *paVar3;
  StreamingReporterBase *in_stack_ffffffffffffff50;
  string local_90 [24];
  string *in_stack_ffffffffffffff88;
  allocator local_69;
  string local_68 [8];
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  XmlWriter *in_stack_ffffffffffffffb0;
  allocator local_31;
  string local_30 [48];
  
  StreamingReporterBase::testCaseStarting(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"TestCase",&local_31);
  this_00 = XmlWriter::startElement
                      ((XmlWriter *)in_stack_ffffffffffffff50,&in_stack_ffffffffffffff48->name);
  paVar3 = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"name",paVar3);
  trim(in_stack_ffffffffffffff88);
  XmlWriter::writeAttribute
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pIVar2 = Ptr<const_Catch::IConfig>::operator->((Ptr<const_Catch::IConfig> *)(in_RDI + 0x10));
  iVar1 = (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])();
  if (iVar1 == 1) {
    Timer::start((Timer *)this_00);
  }
  return;
}

Assistant:

virtual void testCaseStarting( TestCaseInfo const& testInfo ) CATCH_OVERRIDE {
            StreamingReporterBase::testCaseStarting(testInfo);
            m_xml.startElement( "TestCase" ).writeAttribute( "name", trim( testInfo.name ) );

            if ( m_config->showDurations() == ShowDurations::Always )
                m_testCaseTimer.start();
        }